

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  undefined8 *puVar1;
  bool *pbVar2;
  _Rb_tree_node_base *p_Var3;
  Variable<tcu::Matrix<float,_3,_2>_> *pVVar4;
  pointer pcVar5;
  double dVar6;
  undefined8 uVar7;
  PrecisionCase *pPVar8;
  FloatFormat *fmt;
  bool bVar9;
  bool bVar10;
  ContextType type;
  int iVar11;
  _Rb_tree_node_base *p_Var12;
  char *pcVar13;
  size_t sVar14;
  long *plVar15;
  ShaderExecutor *pSVar16;
  Interval *pIVar17;
  IVal *pIVar18;
  MessageBuilder *pMVar19;
  TestError *this_00;
  uint uVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  undefined1 *puVar22;
  Matrix<float,_3,_2> *pMVar23;
  long lVar24;
  size_t size;
  ulong uVar25;
  long lVar26;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  *pVVar27;
  IVal in2;
  IVal in3;
  IVal in1;
  ostringstream os;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  outputs;
  Environment env;
  ShaderSpec spec;
  FloatFormat highpFmt;
  FuncSet funcs;
  ostringstream oss;
  PrecisionCase *local_5e8;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  *local_5e0;
  Matrix<float,_3,_2> *local_5d8;
  string local_5d0;
  Statement *local_5b0;
  ulong local_5a8;
  string local_5a0;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_580;
  ResultCollector *local_578;
  FloatFormat *local_570;
  IVal *local_568;
  long local_560;
  undefined1 local_558 [128];
  undefined1 local_4d8 [8];
  pointer pVStack_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  double local_4b8;
  Data local_4b0;
  undefined4 local_4a0;
  ios_base local_468 [8];
  ios_base local_460 [272];
  size_t local_350;
  ulong local_348;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  local_340;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_310;
  undefined1 local_2e0 [56];
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  FloatFormat local_268;
  undefined1 local_238 [16];
  _Base_ptr local_228;
  _Rb_tree_node_base *local_220;
  _Rb_tree_node_base *local_218;
  double local_210;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_5d8 = (inputs->in0).
              super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pMVar23 = (inputs->in0).
            super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  size = ((long)pMVar23 - (long)local_5d8 >> 3) * -0x5555555555555555;
  local_5e0 = variables;
  local_5b0 = stmt;
  local_580 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  ::Outputs(&local_340,size);
  local_2a8._M_p = (pointer)&local_298;
  local_2e0._0_4_ = GLSL_VERSION_300_ES;
  local_2e0._8_8_ = (pointer)0x0;
  local_2e0._16_8_ = (pointer)0x0;
  local_2e0._24_8_ = (pointer)0x0;
  local_2e0._32_8_ = (pointer)0x0;
  local_2e0._40_8_ = (pointer)0x0;
  local_2e0._48_8_ = (pointer)0x0;
  local_2a0 = 0;
  local_298._M_local_buf[0] = '\0';
  local_288._M_p = (pointer)&local_278;
  local_280 = 0;
  local_278._M_local_buf[0] = '\0';
  local_268.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_268.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_268.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_268.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_268.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_268.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_268.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_268.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_268._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_310._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_310._M_impl.super__Rb_tree_header._M_header;
  local_310._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_310._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_310._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4d8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_310._M_impl.super__Rb_tree_header._M_header._M_right =
       local_310._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,"Statement: ",0xb);
  (*local_5b0->_vptr_Statement[2])(local_5b0,(ostringstream *)&pVStack_4d0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4d0);
  std::ios_base::~ios_base(local_460);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var3 = (_Rb_tree_node_base *)(local_238 + 8);
  local_238._8_4_ = _S_red;
  local_228 = (_Base_ptr)0x0;
  local_210 = 0.0;
  local_5e8 = this;
  local_220 = p_Var3;
  local_218 = p_Var3;
  (*local_5b0->_vptr_Statement[4])(local_5b0,local_238);
  if (local_220 != p_Var3) {
    p_Var12 = local_220;
    do {
      (**(code **)(**(long **)(p_Var12 + 1) + 0x30))(*(long **)(p_Var12 + 1),local_1a8);
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    } while (p_Var12 != p_Var3);
  }
  if (local_210 != 0.0) {
    local_4d8 = (undefined1  [8])((local_5e8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4d0,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4d0,(char *)local_568,local_560);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_568 != (IVal *)local_558) {
      operator_delete(local_568,local_558._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4d0);
    std::ios_base::~ios_base(local_460);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_238);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,"precision ",10);
  pcVar13 = glu::getPrecisionName((local_5e8->m_ctx).precision);
  if (pcVar13 == (char *)0x0) {
    std::ios::clear((int)((long)&local_5e8 + *(long *)((long)local_4d8 + -0x18)) + 0x110);
  }
  else {
    sVar14 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,pcVar13,sVar14);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_1a8);
  pcVar5 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d8);
  std::ios_base::~ios_base(local_468);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_5e8->m_ctx).renderContext)->_vptr_RenderContext[2])();
  pVVar27 = local_5e0;
  local_2e0._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_5e8->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_5e8->m_extension);
    plVar15 = (long *)std::__cxx11::string::append(local_1a8);
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 == paVar21) {
      local_4c8._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_4c8._8_8_ = plVar15[3];
      local_4d8 = (undefined1  [8])&local_4c8;
    }
    else {
      local_4c8._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_4d8 = (undefined1  [8])*plVar15;
    }
    pVStack_4d0 = (pointer)plVar15[1];
    *plVar15 = (long)paVar21;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_4d8);
    if (local_4d8 != (undefined1  [8])&local_4c8) {
      operator_delete((void *)local_4d8,local_4c8._M_allocated_capacity + 1);
    }
    pVVar27 = local_5e0;
    if ((pointer)local_1a8._0_8_ != pcVar5) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_2e0 + 8),1);
  makeSymbol<tcu::Matrix<float,3,2>>
            ((Symbol *)local_4d8,local_5e8,
             (pVVar27->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr);
  uVar7 = local_2e0._8_8_;
  std::__cxx11::string::operator=((string *)local_2e0._8_8_,(string *)local_4d8);
  glu::VarType::operator=((VarType *)(uVar7 + 0x20),(VarType *)&local_4b8);
  glu::VarType::~VarType((VarType *)&local_4b8);
  if (local_4d8 != (undefined1  [8])&local_4c8) {
    operator_delete((void *)local_4d8,local_4c8._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_2e0 + 0x20),2);
  makeSymbol<tcu::Matrix<float,3,2>>
            ((Symbol *)local_4d8,local_5e8,
             (local_5e0->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr);
  uVar7 = local_2e0._32_8_;
  std::__cxx11::string::operator=((string *)(local_2e0._32_8_ + 0x38),(string *)local_4d8);
  glu::VarType::operator=(&((pointer)(uVar7 + 0x38))->varType,(VarType *)&local_4b8);
  glu::VarType::~VarType((VarType *)&local_4b8);
  pVVar27 = local_5e0;
  if (local_4d8 != (undefined1  [8])&local_4c8) {
    operator_delete((void *)local_4d8,local_4c8._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Matrix<float,3,2>>
            ((Symbol *)local_4d8,local_5e8,
             (pVVar27->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr);
  uVar7 = local_2e0._32_8_;
  std::__cxx11::string::operator=((string *)local_2e0._32_8_,(string *)local_4d8);
  glu::VarType::operator=((VarType *)(uVar7 + 0x20),(VarType *)&local_4b8);
  glu::VarType::~VarType((VarType *)&local_4b8);
  if (local_4d8 != (undefined1  [8])&local_4c8) {
    operator_delete((void *)local_4d8,local_4c8._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d8);
  (*local_5b0->_vptr_Statement[2])(local_5b0,local_4d8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d8);
  std::ios_base::~ios_base(local_468);
  std::__cxx11::string::operator=((string *)&local_288,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar8 = local_5e8;
  pSVar16 = ShaderExecUtil::createExecutor
                      ((local_5e8->m_ctx).renderContext,(local_5e8->m_ctx).shaderType,
                       (ShaderSpec *)local_2e0);
  local_4d8 = (undefined1  [8])
              (local_580->in0).
              super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pVStack_4d0 = (local_580->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_4c8._M_allocated_capacity =
       (size_type)
       (local_580->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4c8._8_8_ =
       (local_580->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_340.out0.
       super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_340.out1.
       super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (*pSVar16->_vptr_ShaderExecutor[3])
            (pSVar16,((pPVar8->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar11 = (*pSVar16->_vptr_ShaderExecutor[2])(pSVar16);
  if ((char)iVar11 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar16->_vptr_ShaderExecutor[5])(pSVar16);
  (*pSVar16->_vptr_ShaderExecutor[6])(pSVar16,size & 0xffffffff,local_4d8,local_1a8);
  (*pSVar16->_vptr_ShaderExecutor[1])(pSVar16);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_4d8);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_1a8);
  pVVar27 = local_5e0;
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_238);
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_310,
             (pVVar27->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr,(IVal *)local_4d8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_310,
             (pVVar27->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_568);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_310,
             (pVVar27->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_5d0);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_310,
             (pVVar27->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_5a0);
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_310,
             (pVVar27->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_310,
             (pVVar27->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr,(IVal *)local_238);
  local_350 = size;
  if (pMVar23 == local_5d8) {
    local_5a8 = 0;
  }
  else {
    local_570 = &(local_5e8->m_ctx).floatFormat;
    local_578 = &local_5e8->m_status;
    local_348 = size + (size == 0);
    uVar25 = 0;
    local_5a8 = 0;
    do {
      tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_1a8);
      tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_238);
      if ((uVar25 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_5e8->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_570;
      local_5d8 = (Matrix<float,_3,_2> *)(uVar25 * 0x18);
      round<tcu::Matrix<float,3,2>>
                ((IVal *)&local_568,(BuiltinPrecisionTests *)local_570,
                 (FloatFormat *)
                 ((long)(local_5d8->m_data).m_data[0].m_data +
                 (long)(local_580->in0).
                       super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start),local_5d8);
      pVVar27 = local_5e0;
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)local_4d8,fmt,(IVal *)&local_568);
      pIVar17 = (Interval *)
                Environment::lookup<tcu::Matrix<float,3,2>>
                          ((Environment *)&local_310,
                           (pVVar27->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                           .m_ptr);
      lVar24 = 0;
      pMVar19 = (MessageBuilder *)local_4d8;
      do {
        lVar26 = 0;
        do {
          *(undefined8 *)((long)&pIVar17->m_hi + lVar26) =
               *(undefined8 *)
                (&(pMVar19->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
                lVar26);
          puVar1 = (undefined8 *)((long)&pMVar19->m_log + lVar26);
          dVar6 = (double)puVar1[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_3>,_2> *)&pIVar17->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar26;
          *(undefined8 *)pbVar2 = *puVar1;
          *(double *)(pbVar2 + 8) = dVar6;
          lVar26 = lVar26 + 0x48;
        } while (lVar26 == 0x48);
        lVar24 = lVar24 + 1;
        pIVar17 = pIVar17 + 1;
        pMVar19 = (MessageBuilder *)
                  &(pMVar19->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      } while (lVar24 != 3);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_310,
                 (pVVar27->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_310,
                 (pVVar27->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_310,
                 (pVVar27->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_4b0.basic.type = (local_5e8->m_ctx).precision;
      local_4b8 = local_570->m_maxValue;
      local_4d8 = *(undefined1 (*) [8])local_570;
      pVStack_4d0 = *(pointer *)&local_570->m_fractionBits;
      local_4c8._M_allocated_capacity = *(undefined8 *)&local_570->m_hasInf;
      local_4c8._8_8_ = *(undefined8 *)&local_570->m_exactPrecision;
      local_4a0 = 0;
      local_4b0._8_8_ = &local_310;
      (*local_5b0->_vptr_Statement[3])(local_5b0,(MessageBuilder *)local_4d8);
      pIVar18 = Environment::lookup<tcu::Matrix<float,3,2>>
                          ((Environment *)&local_310,
                           (pVVar27->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)local_4d8,&local_268,pIVar18);
      puVar22 = local_238;
      lVar24 = 0;
      pMVar19 = (MessageBuilder *)local_4d8;
      do {
        lVar26 = 0;
        do {
          *(undefined8 *)(puVar22 + lVar26 + 0x10) =
               *(undefined8 *)
                (&(pMVar19->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
                lVar26);
          puVar1 = (undefined8 *)((long)&pMVar19->m_log + lVar26);
          uVar7 = puVar1[1];
          *(undefined8 *)(puVar22 + lVar26) = *puVar1;
          *(undefined8 *)((long)(puVar22 + lVar26) + 8) = uVar7;
          lVar26 = lVar26 + 0x48;
        } while (lVar26 == 0x48);
        lVar24 = lVar24 + 1;
        puVar22 = puVar22 + 0x18;
        pMVar19 = (MessageBuilder *)
                  &(pMVar19->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      } while (lVar24 != 3);
      bVar9 = contains<tcu::Matrix<float,3,2>>
                        ((IVal *)local_238,
                         (Matrix<float,_3,_2> *)
                         ((long)(local_5d8->m_data).m_data[0].m_data +
                         (long)((local_340.out1.
                                 super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                               m_data));
      local_4d8 = (undefined1  [8])&local_4c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4d8,"Shader output 1 is outside acceptable range","");
      bVar9 = tcu::ResultCollector::check(local_578,bVar9,(string *)local_4d8);
      if (local_4d8 != (undefined1  [8])&local_4c8) {
        operator_delete((void *)local_4d8,(ulong)(local_4c8._M_allocated_capacity + 1));
      }
      pIVar18 = Environment::lookup<tcu::Matrix<float,3,2>>
                          ((Environment *)&local_310,
                           (local_5e0->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)local_4d8,&local_268,pIVar18);
      puVar22 = local_1a8;
      lVar24 = 0;
      pMVar19 = (MessageBuilder *)local_4d8;
      do {
        lVar26 = 0;
        do {
          *(undefined8 *)(puVar22 + lVar26 + 0x10) =
               *(undefined8 *)
                (&(pMVar19->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
                lVar26);
          puVar1 = (undefined8 *)((long)&pMVar19->m_log + lVar26);
          uVar7 = puVar1[1];
          *(undefined8 *)(puVar22 + lVar26) = *puVar1;
          *(undefined8 *)((long)(puVar22 + lVar26) + 8) = uVar7;
          lVar26 = lVar26 + 0x48;
        } while (lVar26 == 0x48);
        lVar24 = lVar24 + 1;
        puVar22 = puVar22 + 0x18;
        pMVar19 = (MessageBuilder *)
                  &(pMVar19->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      } while (lVar24 != 3);
      bVar10 = contains<tcu::Matrix<float,3,2>>
                         ((IVal *)local_1a8,
                          (Matrix<float,_3,_2> *)
                          ((long)(local_5d8->m_data).m_data[0].m_data +
                          (long)((local_340.out0.
                                  super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                                m_data));
      local_4d8 = (undefined1  [8])&local_4c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4d8,"Shader output 0 is outside acceptable range","");
      bVar10 = tcu::ResultCollector::check(local_578,bVar10,(string *)local_4d8);
      if (local_4d8 != (undefined1  [8])&local_4c8) {
        operator_delete((void *)local_4d8,(ulong)(local_4c8._M_allocated_capacity + 1));
      }
      uVar20 = (int)local_5a8 + ((byte)~(bVar9 && bVar10) & 1);
      local_5a8 = (ulong)uVar20;
      if ((int)uVar20 < 0x65 && (!bVar9 || !bVar10)) {
        local_4d8 = (undefined1  [8])((local_5e8->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
        pcVar13 = "Failed";
        if (bVar9 && bVar10) {
          pcVar13 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,pcVar13,6);
        pVVar27 = local_5e0;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,"\t",1);
        pVVar4 = (pVVar27->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                 .m_ptr;
        pMVar23 = (Matrix<float,_3,_2> *)local_558;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        local_568 = (IVal *)pMVar23;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_568,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,(char *)local_568,local_560);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0," = ",3);
        valueToString<tcu::Matrix<float,3,2>>
                  (&local_5d0,(BuiltinPrecisionTests *)&local_268,
                   (FloatFormat *)
                   ((long)(local_5d8->m_data).m_data[0].m_data +
                   (long)(local_580->in0).
                         super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start),pMVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,local_5d0._M_dataplus._M_p,local_5d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
        }
        if (local_568 != (IVal *)local_558) {
          operator_delete(local_568,local_558._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,"\t",1);
        pVVar4 = (pVVar27->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                 .m_ptr;
        pIVar18 = (IVal *)local_558;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        local_568 = pIVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_568,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,(char *)local_568,local_560);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0," = ",3);
        valueToString<tcu::Matrix<float,3,2>>
                  (&local_5d0,(BuiltinPrecisionTests *)&local_268,
                   (FloatFormat *)
                   ((long)(local_5d8->m_data).m_data[0].m_data +
                   (long)((local_340.out0.
                           super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data),
                   (Matrix<float,_3,_2> *)pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,local_5d0._M_dataplus._M_p,local_5d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,3,2>>
                  (&local_5a0,(BuiltinPrecisionTests *)&local_268,(FloatFormat *)local_1a8,pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,local_5a0._M_dataplus._M_p,local_5a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
          operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
        }
        if (local_568 != (IVal *)local_558) {
          operator_delete(local_568,local_558._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,"\t",1);
        pVVar4 = (pVVar27->out1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                 .m_ptr;
        pIVar18 = (IVal *)local_558;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        local_568 = pIVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_568,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,(char *)local_568,local_560);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0," = ",3);
        valueToString<tcu::Matrix<float,3,2>>
                  (&local_5d0,(BuiltinPrecisionTests *)&local_268,
                   (FloatFormat *)
                   ((long)((local_340.out1.
                            super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   (long)(local_5d8->m_data).m_data[0].m_data),(Matrix<float,_3,_2> *)pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,local_5d0._M_dataplus._M_p,local_5d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,3,2>>
                  (&local_5a0,(BuiltinPrecisionTests *)&local_268,(FloatFormat *)local_238,pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,local_5a0._M_dataplus._M_p,local_5a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
          operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
        }
        if (local_568 != (IVal *)local_558) {
          operator_delete(local_568,local_558._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4d0);
        std::ios_base::~ios_base(local_460);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != local_348);
  }
  iVar11 = (int)local_5a8;
  if (100 < iVar11) {
    local_4d8 = (undefined1  [8])((local_5e8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,"(Skipped ",9);
    std::ostream::operator<<((ostringstream *)&pVStack_4d0,iVar11 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4d0);
    std::ios_base::~ios_base(local_460);
  }
  if (iVar11 == 0) {
    local_4d8 = (undefined1  [8])((local_5e8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_4d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4d0," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4d8 = (undefined1  [8])((local_5e8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
    std::ostream::operator<<((ostringstream *)&pVStack_4d0,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_4d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4d0," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4d0);
  std::ios_base::~ios_base(local_460);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p,
                    CONCAT71(local_278._M_allocated_capacity._1_7_,local_278._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_p != &local_298) {
    operator_delete(local_2a8._M_p,
                    CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_2e0 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_2e0 + 8));
  if (local_340.out1.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.out1.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_340.out1.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.out1.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_340.out0.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_340.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}